

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O3

void Rnm_ManStop(Rnm_Man_t *p,int fProfile)

{
  long lVar1;
  undefined4 uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined4 uVar9;
  Vec_Str_t *__ptr;
  char *__ptr_00;
  Vec_Int_t *pVVar7;
  int *piVar8;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  int level;
  double dVar13;
  double dVar14;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  
  if (p != (Rnm_Man_t *)0x0) {
    if ((fProfile != 0) && (p->nCalls != 0)) {
      lVar12 = (long)p->pGia->nTravIdsAlloc * 4 + (long)p->pGia->nObjsAlloc * 0xc + 1000;
      lVar1 = ((long)p->vObjs->nCap + (long)p->nObjsAlloc) * 4 + 0x80;
      lVar3 = p->timeTotal;
      lVar4 = p->timeFwd;
      lVar5 = p->timeBwd;
      lVar6 = p->timeVer;
      level = 0xa0ad7b;
      puts("Abstraction refinement runtime statistics:");
      Abc_Print(level,"%s =","Sensetization");
      dVar13 = 0.0;
      if (p->timeTotal != 0) {
        dVar13 = ((double)p->timeFwd * 100.0) / (double)p->timeTotal;
      }
      local_58._0_4_ = (undefined4)lVar12;
      local_58._4_4_ = (undefined4)((ulong)lVar12 >> 0x20);
      uStack_50._0_4_ = local_58._4_4_;
      local_58 = (double)CONCAT44(0x43300000,(undefined4)local_58);
      uStack_50._4_4_ = 0x45300000;
      local_68._0_4_ = (undefined4)lVar1;
      local_68._4_4_ = (undefined4)((ulong)lVar1 >> 0x20);
      uStack_60._0_4_ = local_68._4_4_;
      local_68 = (double)CONCAT44(0x43300000,(undefined4)local_68);
      uStack_60._4_4_ = 0x45300000;
      Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeFwd / 1000000.0,dVar13);
      Abc_Print(level,"%s =","Justification");
      dVar13 = 0.0;
      if (p->timeTotal != 0) {
        dVar13 = ((double)p->timeBwd * 100.0) / (double)p->timeTotal;
      }
      auVar10._8_4_ = SUB84(uStack_50 - 1.9342813113834067e+25,0);
      auVar10._0_8_ = local_58 - 4503599627370496.0;
      auVar10._12_4_ = (int)((ulong)(uStack_50 - 1.9342813113834067e+25) >> 0x20);
      auVar11._8_4_ = SUB84(uStack_60 - 1.9342813113834067e+25,0);
      auVar11._0_8_ = local_68 - 4503599627370496.0;
      auVar11._12_4_ = (int)((ulong)(uStack_60 - 1.9342813113834067e+25) >> 0x20);
      Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeBwd / 1000000.0,dVar13);
      Abc_Print(level,"%s =","Verification ");
      dVar13 = 0.0;
      if (p->timeTotal != 0) {
        dVar13 = ((double)p->timeVer * 100.0) / (double)p->timeTotal;
      }
      Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeVer / 1000000.0,dVar13);
      Abc_Print(level,"%s =","Other        ");
      dVar13 = (double)(lVar3 - (lVar4 + lVar5 + lVar6));
      dVar14 = 0.0;
      if (p->timeTotal != 0) {
        dVar14 = (dVar13 * 100.0) / (double)p->timeTotal;
      }
      Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar13 / 1000000.0,dVar14);
      Abc_Print(level,"%s =","TOTAL        ");
      dVar14 = (double)p->timeTotal;
      dVar13 = 0.0;
      if (p->timeTotal != 0) {
        dVar13 = (dVar14 * 100.0) / dVar14;
      }
      Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar14 / 1000000.0,dVar13);
      uVar2 = p->nCalls;
      uVar9 = p->nRefines;
      printf("Total calls = %d.  Average refine = %.1f. GIA mem = %.3f MB.  Other mem = %.3f MB.\n",
             (double)(int)uVar9 / (double)(int)uVar2,
             (auVar10._8_8_ + (local_58 - 4503599627370496.0)) * 9.5367431640625e-07,
             SUB84((auVar11._8_8_ + (local_68 - 4503599627370496.0)) * 9.5367431640625e-07,0));
    }
    Gia_ManCleanMark0(p->pGia);
    Gia_ManCleanMark1(p->pGia);
    Gia_ManStaticFanoutStop(p->pGia);
    __ptr = p->vCounts;
    __ptr_00 = __ptr->pArray;
    if (__ptr_00 != (char *)0x0) {
      free(__ptr_00);
    }
    free(__ptr);
    pVVar7 = p->vFanins;
    piVar8 = pVVar7->pArray;
    if (piVar8 != (int *)0x0) {
      free(piVar8);
    }
    free(pVVar7);
    pVVar7 = p->vObjs;
    piVar8 = pVVar7->pArray;
    if (piVar8 != (int *)0x0) {
      free(piVar8);
    }
    free(pVVar7);
    if (p->pObjs != (Rnm_Obj_t *)0x0) {
      free(p->pObjs);
    }
    free(p);
    return;
  }
  return;
}

Assistant:

void Rnm_ManStop( Rnm_Man_t * p, int fProfile )
{
    if ( !p ) return;
    // print runtime statistics
    if ( fProfile && p->nCalls )
    {
        double MemGia = sizeof(Gia_Man_t) + sizeof(Gia_Obj_t) * p->pGia->nObjsAlloc + sizeof(int) * p->pGia->nTravIdsAlloc;
        double MemOther = sizeof(Rnm_Man_t) + sizeof(Rnm_Obj_t) * p->nObjsAlloc + sizeof(int) * Vec_IntCap(p->vObjs);
        abctime timeOther = p->timeTotal - p->timeFwd - p->timeBwd - p->timeVer;
        printf( "Abstraction refinement runtime statistics:\n" );
        ABC_PRTP( "Sensetization", p->timeFwd,   p->timeTotal );
        ABC_PRTP( "Justification", p->timeBwd,   p->timeTotal );
        ABC_PRTP( "Verification ", p->timeVer,   p->timeTotal );
        ABC_PRTP( "Other        ", timeOther,    p->timeTotal );
        ABC_PRTP( "TOTAL        ", p->timeTotal, p->timeTotal );
        printf( "Total calls = %d.  Average refine = %.1f. GIA mem = %.3f MB.  Other mem = %.3f MB.\n", 
            p->nCalls, 1.0*p->nRefines/p->nCalls, MemGia/(1<<20), MemOther/(1<<20) );
    }

    Gia_ManCleanMark0(p->pGia);
    Gia_ManCleanMark1(p->pGia);
    Gia_ManStaticFanoutStop(p->pGia);
//    Gia_ManSetPhase(p->pGia);
//    Vec_IntFree( p->vIsopMem );
//    Vec_IntFree( p->vSatVars );
//    Vec_IntFree( p->vSat2Ids );
    Vec_StrFree( p->vCounts );
    Vec_IntFree( p->vFanins );
    Vec_IntFree( p->vObjs );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}